

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residual_functions.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
IsobarVLEResiduals<double>::call
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          IsobarVLEResiduals<double> *this,vector<double,_std::allocator<double>_> *rhovec)

{
  double *pdVar1;
  PointerType dataPtr;
  MixDerivs<double> *this_00;
  MixDerivs<double> *this_01;
  pointer pdVar2;
  undefined8 uVar3;
  CoeffReturnType pdVar4;
  CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *this_02;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  allocator local_a9;
  double local_a8;
  double local_a0;
  double local_98;
  EigenArray rhovecL;
  _Any_data local_80 [2];
  EigenArray rhovecV;
  
  uVar5 = (long)(rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar5 & 8) != 0) {
    __assert_fail("rhovec.size() % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/include/isochoric/residual_functions.h"
                  ,0x7a,
                  "virtual std::vector<TYPE> IsobarVLEResiduals<>::call(const std::vector<TYPE> &) [TYPE = double]"
                 );
  }
  local_80[0]._M_unused._M_member_pointer = &DAT_7ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)uVar5 >> 3,(value_type_conflict1 *)local_80,
             (allocator_type *)&rhovecL);
  dataPtr = (rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)dataPtr >> 3) >> 1;
  Eigen::
  MapBase<Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           *)local_80,dataPtr,uVar5);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&rhovecL,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_80[0]._M_pod_data);
  Eigen::
  MapBase<Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           *)local_80,
          (rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start + uVar5,uVar5);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&rhovecV,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_80[0]._M_pod_data);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)local_80,this->m_T,(Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  uVar3 = local_80[0]._M_unused._0_8_;
  local_80[0]._M_unused._M_object = (pointer)0x0;
  std::__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  reset((__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
        &this->m_derL,(pointer)uVar3);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )local_80);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)local_80,this->m_T,(Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  uVar3 = local_80[0]._M_unused._0_8_;
  local_80[0]._M_unused._M_object = (void *)0x0;
  std::__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  reset((__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
        &this->m_derV,(pointer)uVar3);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )local_80);
  this_00 = (this->m_derL)._M_t.
            super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
            .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
  this_01 = (this->m_derV)._M_t.
            super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
            .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
  local_a0 = this_00->R;
  dVar6 = MixDerivs<double>::p(this_00);
  local_a8 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_00,0);
  local_98 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_00,1);
  dVar7 = MixDerivs<double>::p(this_01);
  dVar8 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01,0);
  dVar9 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01,1);
  dVar10 = this->m_T * local_a0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecL,0);
  dVar11 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecV,0);
  local_a8 = local_a8 - dVar8;
  dVar11 = log(dVar11 / *pdVar4);
  *(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
   super__Vector_impl_data._M_start = dVar10 * dVar11 + local_a8;
  local_a0 = local_a0 * this->m_T;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecL,1);
  local_a8 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecV,1);
  local_98 = local_98 - dVar9;
  dVar11 = log(local_a8 / *pdVar4);
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[1] = local_a0 * dVar11 + local_98;
  pdVar2[2] = dVar6 - this->m_p;
  pdVar2[3] = dVar7 - this->m_p;
  uVar5 = 0;
  do {
    if ((ulong)((long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar5) {
      free(rhovecV.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      return __return_storage_ptr__;
    }
    pdVar1 = pdVar2 + uVar5;
    uVar5 = uVar5 + 1;
  } while (ABS(*pdVar1) <= 1.79769313486232e+308);
  this_02 = (CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *)__cxa_allocate_exception(0x30)
  ;
  std::__cxx11::string::string((string *)local_80[0]._M_pod_data,"Invalid value found",&local_a9);
  CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::CoolPropError
            (this_02,(string *)local_80,eValue);
  __cxa_throw(this_02,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::typeinfo,
              CoolProp::CoolPropBaseError::~CoolPropBaseError);
}

Assistant:

std::vector<TYPE> call(const std::vector<TYPE> &rhovec) {
        assert(rhovec.size() % 2 == 0); // Even length
        std::vector<TYPE> y(rhovec.size(), _HUGE);
        std::size_t N = rhovec.size() / 2;
        const EigenArray rhovecL = Eigen::Map<const EigenArray>(&(rhovec[0]), N);
        const EigenArray rhovecV = Eigen::Map<const EigenArray>(&(rhovec[0]) + N, N);

        m_derL = m_factory(m_T, rhovecL);
        m_derV = m_factory(m_T, rhovecV);
        auto &derL = *m_derL, &derV = *m_derV;
        TYPE R = derL.R;

        TYPE pL = derL.p(), chempotr0L = derL.dpsir_drhoi__constTrhoj(0), chempotr1L = derL.dpsir_drhoi__constTrhoj(1);
        TYPE pV = derV.p(), chempotr0V = derV.dpsir_drhoi__constTrhoj(0), chempotr1V = derV.dpsir_drhoi__constTrhoj(1);

        y[0] = chempotr0L - chempotr0V + R*m_T*log(rhovecL[0]/rhovecV[0]);
        y[1] = chempotr1L - chempotr1V + R*m_T*log(rhovecL[1]/rhovecV[1]);
        y[2] = pL - m_p;
        y[3] = pV - m_p;
        for (std::size_t i = 0; i < y.size(); ++i) {
            if (!ValidNumber(y[i])) {
                throw ValueError("Invalid value found");
            }
        }
        return y;
    }